

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall iqnet::Reactor<boost::mutex>::handle_user_events(Reactor<boost::mutex> *this)

{
  short sVar1;
  bool bVar2;
  pointer pHVar3;
  reference __x;
  reference pvVar4;
  value_type local_60;
  HandlerState hs;
  _Self local_50;
  hs_iterator i;
  undefined1 local_38 [8];
  scoped_lock lk;
  HandlerStateList called_by_user;
  Reactor<boost::mutex> *this_local;
  
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)&lk.is_locked);
  boost::unique_lock<boost::mutex>::unique_lock((unique_lock<boost::mutex> *)local_38,&this->lock);
  local_50._M_node = (_List_node_base *)begin(this);
  while( true ) {
    hs = (HandlerState)end(this);
    bVar2 = std::operator!=(&local_50,(_Self *)&hs);
    if (!bVar2) break;
    pHVar3 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
    if (pHVar3->revents != 0) {
      pHVar3 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
      sVar1 = pHVar3->mask;
      pHVar3 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
      if (sVar1 != 0 || pHVar3->revents != 0) {
        __x = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator*(&local_50);
        std::__cxx11::
        list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
        ::push_back((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     *)&lk.is_locked,__x);
        pHVar3 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
        sVar1 = pHVar3->mask;
        pHVar3 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
        pHVar3->revents = pHVar3->revents & (ushort)((sVar1 != 0 ^ 0xffU) & 1);
      }
    }
    std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator++(&local_50);
  }
  boost::unique_lock<boost::mutex>::unlock((unique_lock<boost::mutex> *)local_38);
  while( true ) {
    bVar2 = std::__cxx11::
            list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
            ::empty((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     *)&lk.is_locked);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar4 = std::__cxx11::
             list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
             ::front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                      *)&lk.is_locked);
    local_60 = *pvVar4;
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    pop_front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
               *)&lk.is_locked);
    invoke_event_handler(this,&local_60);
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)local_38);
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::~list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)&lk.is_locked);
  return;
}

Assistant:

void Reactor<Lock>::handle_user_events()
{
  HandlerStateList called_by_user;
  scoped_lock lk(lock);

  for( hs_iterator i = begin(); i != end(); ++i )
  {
    if( i->revents && (i->mask | i->revents) )
    {
      called_by_user.push_back( *i );
      i->revents &= !i->mask;
    }
  }

  lk.unlock();

  while( !called_by_user.empty() )
  {
    HandlerState hs(called_by_user.front());
    called_by_user.pop_front();
    invoke_event_handler(hs);
  }
}